

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afangles.c
# Opt level: O3

void af_sort_and_quantize_widths(FT_UInt *count,AF_Width table,FT_Pos threshold)

{
  AF_Width pAVar1;
  FT_Pos FVar2;
  FT_Pos FVar3;
  FT_Pos FVar4;
  uint uVar5;
  uint uVar6;
  AF_Width pAVar7;
  uint uVar8;
  long lVar10;
  ulong uVar11;
  FT_Pos FVar12;
  long lVar13;
  AF_WidthRec swap;
  ulong uVar9;
  
  if (*count == 0) {
    uVar5 = 1;
  }
  else {
    if (*count == 1) {
      return;
    }
    uVar5 = 1;
    do {
      uVar11 = (ulong)uVar5;
      do {
        uVar8 = (int)uVar11 - 1;
        uVar9 = (ulong)uVar8;
        if (table[uVar9].org <= table[uVar11].org) break;
        pAVar7 = table + uVar11;
        pAVar1 = table + uVar9;
        FVar12 = pAVar7->fit;
        FVar2 = pAVar7->org;
        FVar3 = pAVar7->cur;
        pAVar7->fit = pAVar1->fit;
        FVar4 = pAVar1->cur;
        pAVar7->org = pAVar1->org;
        pAVar7->cur = FVar4;
        pAVar1->fit = FVar12;
        pAVar1->org = FVar2;
        pAVar1->cur = FVar3;
        uVar11 = uVar9;
      } while (uVar8 != 0);
      uVar8 = *count;
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar8);
    uVar5 = 1;
    if (1 < uVar8) {
      FVar12 = table->org;
      uVar6 = uVar8 - 1;
      uVar11 = 0;
      do {
        lVar10 = table[uVar5].org - FVar12;
        if ((uVar5 == uVar6) || (threshold < lVar10)) {
          uVar5 = (lVar10 <= threshold && uVar5 == uVar6) + uVar5;
          if ((uint)uVar11 < uVar5) {
            uVar9 = (ulong)uVar5;
            pAVar7 = table + uVar11;
            lVar13 = uVar11 - uVar9;
            lVar10 = 0;
            do {
              lVar10 = lVar10 + pAVar7->org;
              pAVar7->org = 0;
              pAVar7 = pAVar7 + 1;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0);
          }
          else {
            lVar10 = 0;
            uVar9 = uVar11;
          }
          table[uVar11].org = lVar10 / (long)uVar9;
          if (uVar5 < uVar6) {
            uVar11 = (ulong)(uVar5 + 1);
            FVar12 = table[uVar11].org;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar8);
      uVar5 = 1;
      if (1 < uVar8) {
        pAVar7 = table + 1;
        uVar11 = 1;
        uVar6 = uVar5;
        do {
          uVar5 = uVar6;
          if (pAVar7->org != 0) {
            uVar5 = uVar6 + 1;
            table[uVar6].fit = pAVar7->fit;
            FVar12 = pAVar7->cur;
            table[uVar6].org = pAVar7->org;
            table[uVar6].cur = FVar12;
            uVar8 = *count;
          }
          uVar11 = uVar11 + 1;
          pAVar7 = pAVar7 + 1;
          uVar6 = uVar5;
        } while (uVar11 < uVar8);
      }
    }
  }
  *count = uVar5;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_sort_and_quantize_widths( FT_UInt*  count,
                               AF_Width  table,
                               FT_Pos    threshold )
  {
    FT_UInt      i, j;
    FT_UInt      cur_idx;
    FT_Pos       cur_val;
    FT_Pos       sum;
    AF_WidthRec  swap;


    if ( *count == 1 )
      return;

    /* sort */
    for ( i = 1; i < *count; i++ )
    {
      for ( j = i; j > 0; j-- )
      {
        if ( table[j].org >= table[j - 1].org )
          break;

        swap         = table[j];
        table[j]     = table[j - 1];
        table[j - 1] = swap;
      }
    }

    cur_idx = 0;
    cur_val = table[cur_idx].org;

    /* compute and use mean values for clusters not larger than  */
    /* `threshold'; this is very primitive and might not yield   */
    /* the best result, but normally, using reference character  */
    /* `o', `*count' is 2, so the code below is fully sufficient */
    for ( i = 1; i < *count; i++ )
    {
      if ( table[i].org - cur_val > threshold ||
           i == *count - 1                    )
      {
        sum = 0;

        /* fix loop for end of array */
        if ( table[i].org - cur_val <= threshold &&
             i == *count - 1                     )
          i++;

        for ( j = cur_idx; j < i; j++ )
        {
          sum         += table[j].org;
          table[j].org = 0;
        }
        table[cur_idx].org = sum / (FT_Pos)j;

        if ( i < *count - 1 )
        {
          cur_idx = i + 1;
          cur_val = table[cur_idx].org;
        }
      }
    }

    cur_idx = 1;

    /* compress array to remove zero values */
    for ( i = 1; i < *count; i++ )
    {
      if ( table[i].org )
        table[cur_idx++] = table[i];
    }

    *count = cur_idx;
  }